

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageIO.cpp
# Opt level: O0

void Imf_3_2::anon_unknown_27::saveLevel(TiledOutputFile *out,FlatImage *img,int x,int y)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  string *psVar4;
  FlatImageChannel *pFVar5;
  undefined4 in_ECX;
  int in_EDX;
  long *in_RSI;
  int iVar6;
  FrameBuffer *in_RDI;
  ConstIterator i;
  FrameBuffer fb;
  FlatImageLevel *level;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  ConstIterator *in_stack_ffffffffffffff10;
  undefined1 local_a8 [56];
  const_iterator local_70;
  const_iterator local_58;
  string local_50 [48];
  undefined8 local_20;
  int local_14;
  FrameBuffer *local_8;
  
  local_14 = in_EDX;
  local_8 = in_RDI;
  local_20 = (**(code **)(*in_RSI + 0x30))(in_RSI,in_EDX,in_ECX);
  FrameBuffer::FrameBuffer((FrameBuffer *)0x12e5a9);
  local_58._M_node =
       (_Base_ptr)
       FlatImageLevel::begin
                 ((FlatImageLevel *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  while( true ) {
    local_70._M_node =
         (_Base_ptr)
         FlatImageLevel::end((FlatImageLevel *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    bVar1 = operator!=(in_stack_ffffffffffffff10,
                       (ConstIterator *)
                       CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
    if (!bVar1) break;
    psVar4 = FlatImageLevel::ConstIterator::name_abi_cxx11_((ConstIterator *)0x12e625);
    pFVar5 = FlatImageLevel::ConstIterator::channel((ConstIterator *)0x12e634);
    (*(pFVar5->super_ImageChannel)._vptr_ImageChannel[4])(local_a8);
    Imf_3_2::FrameBuffer::insert(local_50,(Slice *)psVar4);
    FlatImageLevel::ConstIterator::operator++(in_stack_ffffffffffffff10);
  }
  Imf_3_2::TiledOutputFile::setFrameBuffer(local_8);
  iVar6 = (int)local_8;
  local_8._0_4_ = iVar6;
  iVar2 = Imf_3_2::TiledOutputFile::numXTiles(iVar6);
  iVar3 = Imf_3_2::TiledOutputFile::numYTiles((int)local_8);
  Imf_3_2::TiledOutputFile::writeTiles(iVar6,0,iVar2 + -1,0,iVar3 + -1,local_14);
  FrameBuffer::~FrameBuffer((FrameBuffer *)0x12e731);
  return;
}

Assistant:

void
saveLevel (TiledOutputFile& out, const FlatImage& img, int x, int y)
{
    const FlatImageLevel& level = img.level (x, y);
    FrameBuffer           fb;

    for (FlatImageLevel::ConstIterator i = level.begin (); i != level.end ();
         ++i)
        fb.insert (i.name (), i.channel ().slice ());

    out.setFrameBuffer (fb);
    out.writeTiles (0, out.numXTiles (x) - 1, 0, out.numYTiles (y) - 1, x, y);
}